

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

String * kj::operator*(String *__return_storage_ptr__,Exception *param_2,undefined8 param_3,
                      int *param_4)

{
  bool bVar1;
  Context *pCVar2;
  String *this;
  size_t sVar3;
  ulong index;
  ArrayPtr<void_*const> AVar4;
  char (*in_stack_fffffffffffffde0) [2];
  String *in_stack_fffffffffffffe08;
  String local_140;
  ArrayPtr<void_*const> local_128;
  String local_118;
  ArrayPtr<void_*const> local_100;
  undefined1 local_f0 [24];
  ArrayPtr<const_char> local_d8;
  char *local_c8;
  Type local_c0;
  int local_bc;
  undefined1 local_b8 [8];
  String local_b0;
  Context *local_98;
  String local_90;
  Context *local_78;
  Context *c_1;
  Context *local_60;
  undefined1 local_58 [8];
  Array<kj::String> contextText;
  Context *c;
  Maybe<const_kj::Exception::Context_&> contextPtr;
  uint contextDepth;
  Exception *e_local;
  
  contextPtr.ptr._4_4_ = 0;
  c = (Context *)Exception::getContext(param_2);
  while( true ) {
    pCVar2 = _::readMaybe<kj::Exception::Context_const>((Maybe<const_kj::Exception::Context_&> *)&c)
    ;
    if (pCVar2 == (Context *)0x0) break;
    contextPtr.ptr._4_4_ = contextPtr.ptr._4_4_ + 1;
    contextText.disposer = (ArrayDisposer *)Maybe::operator_cast_to_Maybe((Maybe *)&pCVar2->next);
    c = (Context *)contextText.disposer;
  }
  heapArray<kj::String>((Array<kj::String> *)local_58,(ulong)contextPtr.ptr._4_4_);
  contextPtr.ptr._4_4_ = 0;
  local_60 = (Context *)Exception::getContext(param_2);
  c = local_60;
  while( true ) {
    local_78 = _::readMaybe<kj::Exception::Context_const>
                         ((Maybe<const_kj::Exception::Context_&> *)&c);
    if (local_78 == (Context *)0x0) break;
    param_4 = &local_78->line;
    str<char_const*const&,char_const(&)[2],int_const&,char_const(&)[12],kj::String_const&,char_const(&)[2]>
              (&local_90,(kj *)local_78,(char **)0x6781e9,(char (*) [2])param_4,(int *)": context: "
               ,(char (*) [12])&local_78->description,(String *)0x669885,in_stack_fffffffffffffde0);
    index = (ulong)contextPtr.ptr._4_4_;
    contextPtr.ptr._4_4_ = contextPtr.ptr._4_4_ + 1;
    this = Array<kj::String>::operator[]((Array<kj::String> *)local_58,index);
    String::operator=(this,&local_90);
    String::~String(&local_90);
    local_98 = (Context *)Maybe::operator_cast_to_Maybe((Maybe *)&local_78->next);
    c = local_98;
  }
  strArray<kj::Array<kj::String>&>
            (&local_b0,(kj *)local_58,(Array<kj::String> *)0x632948,(char *)param_4);
  local_b8 = (undefined1  [8])Exception::getFile(param_2);
  local_bc = Exception::getLine(param_2);
  local_c0 = Exception::getType(param_2);
  local_d8 = (ArrayPtr<const_char>)Exception::getDescription(param_2);
  bVar1 = StringPtr::operator==((StringPtr *)&local_d8,(void *)0x0);
  local_c8 = ": ";
  if (bVar1) {
    local_c8 = "";
  }
  local_f0._8_16_ = (undefined1  [16])Exception::getDescription(param_2);
  local_100 = Exception::getStackTrace(param_2);
  sVar3 = ArrayPtr<void_*const>::size(&local_100);
  local_f0._0_8_ = "";
  if (sVar3 != 0) {
    local_f0._0_8_ = "\nstack: ";
  }
  local_128 = Exception::getStackTrace(param_2);
  AVar4.ptr = (void **)local_128.size_;
  AVar4.size_ = (size_t)local_128.ptr;
  stringifyStackTraceAddresses(&local_118,(kj *)local_128.ptr,AVar4);
  AVar4 = Exception::getStackTrace(param_2);
  stringifyStackTrace(&local_140,AVar4);
  str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
            (__return_storage_ptr__,(kj *)&local_b0,(String *)local_b8,(char **)0x6781e9,
             (char (*) [2])&local_bc,(int *)0x679aee,(char (*) [3])&local_c0,(Type *)&local_c8,
             (char **)(local_f0 + 8),(StringPtr *)local_f0,(char **)&local_118,&local_140,
             in_stack_fffffffffffffe08);
  String::~String(&local_140);
  String::~String(&local_118);
  String::~String(&local_b0);
  Array<kj::String>::~Array((Array<kj::String> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(const Exception& e) {
  uint contextDepth = 0;

  Maybe<const Exception::Context&> contextPtr = e.getContext();
  for (;;) {
    KJ_IF_MAYBE(c, contextPtr) {
      ++contextDepth;
      contextPtr = c->next;
    } else {
      break;
    }
  }